

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall
wasm::Wasm2JSBuilder::addFunctionImport(Wasm2JSBuilder *this,Ref ast,Function *import)

{
  bool bVar1;
  Ref r;
  Value *this_00;
  Ref RVar2;
  Ref in_R8;
  IString IVar3;
  IString name;
  Ref local_60;
  char *local_58;
  Ref theVar;
  Function *import_local;
  Wasm2JSBuilder *this_local;
  Ref ast_local;
  
  IVar3.str._M_str = (char *)import;
  IVar3.str._M_len = (size_t)(import->super_Importable).base.super_IString.str._M_str;
  this_local = (Wasm2JSBuilder *)ast.inst;
  bVar1 = ABI::wasm2js::isHelper
                    ((wasm2js *)(import->super_Importable).base.super_IString.str._M_len,IVar3);
  if (!bVar1) {
    ensureModuleVar(this,(Ref)this_local,&import->super_Importable);
    r = cashew::ValueBuilder::makeVar(false);
    this_00 = cashew::Ref::operator->((Ref *)&this_local);
    cashew::Value::push_back(this_00,r);
    IVar3 = fromName(this,(import->super_Importable).super_Named.name.super_IString.str,Top);
    RVar2 = getImportName(this,&import->super_Importable);
    local_60.inst = (Value *)IVar3.str._M_len;
    local_58 = IVar3.str._M_str;
    name.str._M_str = (char *)RVar2.inst;
    name.str._M_len = (size_t)local_58;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)r.inst,local_60,name,in_R8);
  }
  return;
}

Assistant:

void Wasm2JSBuilder::addFunctionImport(Ref ast, Function* import) {
  // The scratch memory helpers are emitted in the glue, see code and comments
  // below.
  if (ABI::wasm2js::isHelper(import->base)) {
    return;
  }
  ensureModuleVar(ast, *import);
  Ref theVar = ValueBuilder::makeVar();
  ast->push_back(theVar);
  ValueBuilder::appendToVar(
    theVar, fromName(import->name, NameScope::Top), getImportName(*import));
}